

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O3

void dump_mmt_buf_as_words_desc(mmt_buf *buf,_func_char_ptr_uint32_t *fun)

{
  char *pcVar1;
  ulong uVar2;
  
  if (3 < buf->len) {
    uVar2 = 0;
    do {
      if ((fun == (_func_char_ptr_uint32_t *)0x0) ||
         (pcVar1 = (*fun)(buf[uVar2 + 1].len), pcVar1 == (char *)0x0)) {
        if (indent_logs == 0) {
          fprintf(_stdout,"LOG:         0x%08x\n",(ulong)buf[uVar2 + 1].len);
        }
        else {
          fprintf(_stdout,"%64s        0x%08x\n"," ");
        }
      }
      else if (indent_logs == 0) {
        fprintf(_stdout,"LOG:         0x%08x   [%s]\n",(ulong)buf[uVar2 + 1].len,pcVar1);
      }
      else {
        fprintf(_stdout,"%64s        0x%08x   [%s]\n"," ",(ulong)buf[uVar2 + 1].len,pcVar1);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < buf->len >> 2);
  }
  return;
}

Assistant:

void dump_mmt_buf_as_words_desc(struct mmt_buf *buf, const char *(*fun)(uint32_t))
{
	int j;
	uint32_t *data = (uint32_t *)buf->data;
	for (j = 0; j < buf->len / 4; ++j)
	{
		const char *tmp = NULL;
		if (fun)
			tmp = fun(data[j]);

		if (tmp)
			mmt_log("        0x%08x   [%s]\n", data[j], tmp);
		else
			mmt_log("        0x%08x\n", data[j]);
	}
}